

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall
Importer_multipleModelResolution_Test::TestBody(Importer_multipleModelResolution_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  ImporterPtr importer;
  ModelPtr modelB;
  ModelPtr modelA;
  ParserPtr parser;
  long *local_a0 [2];
  long local_90 [2];
  unsigned_long local_80;
  string local_78;
  undefined7 uStack_77;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68 [2];
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"importer/generic.cellml","");
  fileContents(&local_78);
  libcellml::Parser::parseModel(local_38);
  if ((long *)CONCAT71(uStack_77,local_78) != local_68) {
    operator_delete((long *)CONCAT71(uStack_77,local_78),local_68[0] + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"importer/generic.cellml","");
  fileContents(&local_78);
  libcellml::Parser::parseModel(local_48);
  if ((long *)CONCAT71(uStack_77,local_78) != local_68) {
    operator_delete((long *)CONCAT71(uStack_77,local_78),local_68[0] + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_58,0));
  psVar1 = local_58;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"importer/","");
  resourcePath(&local_78);
  libcellml::Importer::resolveImports(psVar1,local_38);
  if ((long *)CONCAT71(uStack_77,local_78) != local_68) {
    operator_delete((long *)CONCAT71(uStack_77,local_78),local_68[0] + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  local_a0[0] = (long *)0x1;
  local_80 = libcellml::Importer::libraryCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_78,"size_t(1)","importer->libraryCount()",(unsigned_long *)local_a0,
             &local_80);
  if (local_78 == (string)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x166,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_a0[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a0[0] != (long *)0x0)) {
        (**(code **)(*local_a0[0] + 8))();
      }
      local_a0[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"importer/","");
  resourcePath(&local_78);
  libcellml::Importer::resolveImports(local_58,local_48);
  if ((long *)CONCAT71(uStack_77,local_78) != local_68) {
    operator_delete((long *)CONCAT71(uStack_77,local_78),local_68[0] + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  local_a0[0] = (long *)0x1;
  local_80 = libcellml::Importer::libraryCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_78,"size_t(1)","importer->libraryCount()",(unsigned_long *)local_a0,
             &local_80);
  if (local_78 == (string)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_a0[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a0[0] != (long *)0x0)) {
        (**(code **)(*local_a0[0] + 8))();
      }
      local_a0[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, multipleModelResolution)
{
    // This test is intended to show how the Importer class can hold multiple imported models in its library, and that
    // these can be used to resolve the imports of more than one importing model.
    // The example given has two models A, B, each importing the same four components, a, b, c, d from a
    // third model D. We expect that model D is parsed and instantiated just once, rather than 8 times.

    auto parser = libcellml::Parser::create();
    auto modelA = parser->parseModel(fileContents("importer/generic.cellml"));
    auto modelB = parser->parseModel(fileContents("importer/generic.cellml"));

    // Model D will be imported into the library as it's included as a dependency in the models here.
    // Passing in one of the models for resolution will load model D into the library.
    auto importer = libcellml::Importer::create();
    importer->resolveImports(modelA, resourcePath("importer/"));

    EXPECT_EQ(size_t(1), importer->libraryCount());

    // Now resolve the other models and expect the library contents to be unchanged.
    importer->resolveImports(modelB, resourcePath("importer/"));

    EXPECT_EQ(size_t(1), importer->libraryCount());
}